

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int key_schedule_select_one(ptls_key_schedule_t *sched,ptls_cipher_suite_t *cs,int reset)

{
  int iVar1;
  ptls_iovec_t ikm;
  size_t sStack_30;
  int ret;
  size_t i;
  size_t found_slot;
  int reset_local;
  ptls_cipher_suite_t *cs_local;
  ptls_key_schedule_t *sched_local;
  
  i = 0xffffffffffffffff;
  if (sched->generation != 1) {
    __assert_fail("sched->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0x376,
                  "int key_schedule_select_one(ptls_key_schedule_t *, ptls_cipher_suite_t *, int)");
  }
  for (sStack_30 = 0; sStack_30 != sched->num_hashes; sStack_30 = sStack_30 + 1) {
    if (sched->hashes[sStack_30].algo == cs->hash) {
      if (i != 0xffffffffffffffff) {
        __assert_fail("found_slot == SIZE_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                      ,0x37b,
                      "int key_schedule_select_one(ptls_key_schedule_t *, ptls_cipher_suite_t *, int)"
                     );
      }
      i = sStack_30;
    }
    else {
      (*(sched->hashes[sStack_30].ctx)->final)
                (sched->hashes[sStack_30].ctx,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    }
  }
  found_slot._4_4_ = reset;
  if (i != 0) {
    sched->hashes[0].algo = sched->hashes[i].algo;
    sched->hashes[0].ctx = sched->hashes[i].ctx;
    found_slot._4_4_ = 1;
  }
  sched->num_hashes = 1;
  if (found_slot._4_4_ != 0) {
    sched->generation = sched->generation - 1;
    memset(sched->secret,0,0x40);
    ikm = ptls_iovec_init((void *)0x0,0);
    iVar1 = key_schedule_extract(sched,ikm);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int key_schedule_select_one(ptls_key_schedule_t *sched, ptls_cipher_suite_t *cs, int reset)
{
    size_t found_slot = SIZE_MAX, i;
    int ret;

    assert(sched->generation == 1);

    /* find the one, while freeing others */
    for (i = 0; i != sched->num_hashes; ++i) {
        if (sched->hashes[i].algo == cs->hash) {
            assert(found_slot == SIZE_MAX);
            found_slot = i;
        } else {
            sched->hashes[i].ctx->final(sched->hashes[i].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
        }
    }
    if (found_slot != 0) {
        sched->hashes[0] = sched->hashes[found_slot];
        reset = 1;
    }
    sched->num_hashes = 1;

    /* recalculate the hash if a different hash as been selected than the one we used for calculating the early secrets */
    if (reset) {
        --sched->generation;
        memset(sched->secret, 0, sizeof(sched->secret));
        if ((ret = key_schedule_extract(sched, ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}